

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_function::run_impl(statement_function *this)

{
  function *in_RDI;
  var func;
  bool in_stack_0000009f;
  var *in_stack_000000a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000a8;
  domain_manager *in_stack_000000b0;
  types local_10 [4];
  
  if (((ulong)in_RDI[1].mBody.
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur & 0x100) == 0) {
    cs_impl::any::make_protect<cs::callable,cs::function&>(in_RDI);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1e053a);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1e0546);
    domain_manager::add_var_no_return<std::__cxx11::string&>
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_0000009f);
    cs_impl::any::~any((any *)0x1e0578);
  }
  else {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1e047e);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1e048a);
    cs_impl::any::make_protect<cs::callable,cs::function&,cs::callable::types>(in_RDI,local_10);
    domain_manager::add_var_no_return<std::__cxx11::string&>
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_0000009f);
    cs_impl::any::~any((any *)0x1e04f3);
  }
  return;
}

Assistant:

void statement_function::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (this->mIsMemFn)
			context->instance->storage.add_var_no_return(this->mName,
			        var::make_protect<callable>(this->mFunc, callable::types::member_fn),
			        mOverride);
		else {
			var func = var::make_protect<callable>(this->mFunc);
#ifdef CS_DEBUGGER
			if(context->instance->storage.is_initial())
				cs_debugger_func_breakpoint(this->mName, func);
#endif
			context->instance->storage.add_var_no_return(this->mName, func, mOverride);
		}
	}